

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O2

void __thiscall
coinscachepair_tests::linked_list_random_deletion::test_method(linked_list_random_deletion *this)

{
  long lVar1;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> __x;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> __x_00;
  _List_iterator<std::pair<const_COutPoint,_CCoinsCacheEntry>_> __position;
  CoinsCachePair *pCVar2;
  CoinsCachePair *sentinel_00;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  CoinsCachePair **ppCVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  CoinsCachePair *local_150;
  CoinsCachePair *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair sentinel;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::pair<const_COutPoint,_CCoinsCacheEntry>::pair<const_COutPoint,_CCoinsCacheEntry,_true>
            (&sentinel);
  sentinel.second.m_flags = '\x01';
  sentinel.second.m_prev = &sentinel;
  sentinel.second.m_next = &sentinel;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)&sentinel,sentinel_00);
  __x = std::next<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>
                  (nodes.
                   super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next,1);
  __x_00 = std::next<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>(__x,1);
  __position = std::next<std::_List_iterator<std::pair<COutPoint_const,CCoinsCacheEntry>>>(__x_00,1)
  ;
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::erase(&nodes,(const_iterator)__x._M_node);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6c;
  file.m_begin = (iterator)&local_d0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_e0,msg);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_108 = "";
  local_150 = (CoinsCachePair *)
              CONCAT71(local_150._1_7_,
                       *(undefined1 *)
                        &nodes.
                         super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev);
  local_148 = (CoinsCachePair *)CONCAT44(local_148._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_150;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_100,&local_110,0x6c,1,2,&local_150,"n1->second.GetFlags()",&local_148,
             "CCoinsCacheEntry::DIRTY");
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6d;
  file_00.m_begin = (iterator)&local_120;
  msg_00.m_end = (iterator)ppCVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
             msg_00);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_138 = "";
  local_148 = (CoinsCachePair *)
              nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
              ._M_impl._M_node.super__List_node_base._M_next[4]._M_next;
  pCVar2 = (CoinsCachePair *)(__x_00._M_node + 1);
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_148;
  local_150 = pCVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_140,0x6d,1,2,&local_148,"n1->second.Next()",&local_150,"&(*n3)");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x6e;
  file_01.m_begin = (iterator)&local_160;
  msg_01.m_end = (iterator)ppCVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
             msg_01);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_178 = "";
  local_150 = (CoinsCachePair *)CONCAT71(local_150._1_7_,*(undefined1 *)&__x_00._M_node[4]._M_prev);
  local_148 = (CoinsCachePair *)CONCAT44(local_148._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_150;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_100,&local_180,0x6e,1,2,&local_150,"n3->second.GetFlags()",&local_148,
             "CCoinsCacheEntry::DIRTY");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x6f;
  file_02.m_begin = (iterator)&local_190;
  msg_02.m_end = (iterator)ppCVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1a0,
             msg_02);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_148 = (CoinsCachePair *)__x_00._M_node[4]._M_next;
  ppCVar4 = &local_148;
  pvVar3 = (iterator)0x2;
  local_150 = (CoinsCachePair *)(__position._M_node + 1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_1b0,0x6f,1,2,ppCVar4,"n3->second.Next()",&local_150,"&(*n4)");
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x70;
  file_03.m_begin = (iterator)&local_1c0;
  msg_03.m_end = (iterator)ppCVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d0,
             msg_03);
  local_150 = (CoinsCachePair *)
              (nodes.
               super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
               ._M_impl._M_node.super__List_node_base._M_next + 1);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d8 = "";
  local_148 = (CoinsCachePair *)__x_00._M_node[3]._M_prev;
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_148;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_1e0,0x70,1,2,&local_148,"n3->second.Prev()",&local_150,"&(*n1)");
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::erase(&nodes,(const_iterator)
                 nodes.
                 super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next);
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x77;
  file_04.m_begin = (iterator)&local_1f0;
  msg_04.m_end = (iterator)ppCVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_200,
             msg_04);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_208 = "";
  local_150 = (CoinsCachePair *)CONCAT71(local_150._1_7_,*(undefined1 *)&__x_00._M_node[4]._M_prev);
  local_148 = (CoinsCachePair *)CONCAT44(local_148._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_150;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_100,&local_210,0x77,1,2,&local_150,"n3->second.GetFlags()",&local_148,
             "CCoinsCacheEntry::DIRTY");
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x78;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = (iterator)ppCVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_238 = "";
  ppCVar4 = &local_148;
  local_148 = sentinel.second.m_next;
  pvVar3 = (iterator)0x2;
  local_150 = pCVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_240,0x78,1,2,ppCVar4,"sentinel.second.Next()",&local_150,"&(*n3)");
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x79;
  file_06.m_begin = (iterator)&local_250;
  msg_06.m_end = (iterator)ppCVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_260,
             msg_06);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_268 = "";
  local_148 = (CoinsCachePair *)__x_00._M_node[4]._M_next;
  ppCVar4 = &local_148;
  pvVar3 = (iterator)0x2;
  local_150 = (CoinsCachePair *)(__position._M_node + 1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_270,0x79,1,2,ppCVar4,"n3->second.Next()",&local_150,"&(*n4)");
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x7a;
  file_07.m_begin = (iterator)&local_280;
  msg_07.m_end = (iterator)ppCVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_290,
             msg_07);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_298 = "";
  local_148 = (CoinsCachePair *)__x_00._M_node[3]._M_prev;
  local_150 = &sentinel;
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_148;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_2a0,0x7a,1,2,&local_148,"n3->second.Prev()",&local_150,"&sentinel");
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::erase(&nodes,(const_iterator)__position._M_node);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x81;
  file_08.m_begin = (iterator)&local_2b0;
  msg_08.m_end = (iterator)ppCVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2c0,
             msg_08);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2c8 = "";
  local_150 = (CoinsCachePair *)CONCAT71(local_150._1_7_,*(undefined1 *)&__x_00._M_node[4]._M_prev);
  local_148 = (CoinsCachePair *)CONCAT44(local_148._4_4_,1);
  pvVar3 = (iterator)0x2;
  ppCVar4 = &local_150;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,CCoinsCacheEntry::Flags>
            (&local_100,&local_2d0,0x81,1,2,&local_150,"n3->second.GetFlags()",&local_148,
             "CCoinsCacheEntry::DIRTY");
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x82;
  file_09.m_begin = (iterator)&local_2e0;
  msg_09.m_end = (iterator)ppCVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2f0,
             msg_09);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2f8 = "";
  ppCVar4 = &local_148;
  local_148 = sentinel.second.m_next;
  pvVar3 = (iterator)0x2;
  local_150 = pCVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_300,0x82,1,2,ppCVar4,"sentinel.second.Next()",&local_150,"&(*n3)");
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x83;
  file_10.m_begin = (iterator)&local_310;
  msg_10.m_end = (iterator)ppCVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_320,
             msg_10);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_328 = "";
  local_148 = (CoinsCachePair *)__x_00._M_node[4]._M_next;
  ppCVar4 = &local_148;
  local_150 = &sentinel;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_330,0x83,1,2,ppCVar4,"n3->second.Next()",&local_150,"&sentinel");
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x84;
  file_11.m_begin = (iterator)&local_340;
  msg_11.m_end = (iterator)ppCVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_350,
             msg_11);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_358 = "";
  ppCVar4 = &local_148;
  local_148 = sentinel.second.m_prev;
  pvVar3 = (iterator)0x2;
  local_150 = pCVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_360,0x84,1,2,ppCVar4,"sentinel.second.Prev()",&local_150,"&(*n3)");
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::erase(&nodes,(const_iterator)__x_00._M_node);
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x8a;
  file_12.m_begin = (iterator)&local_370;
  msg_12.m_end = (iterator)ppCVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_380,
             msg_12);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_388 = "";
  ppCVar4 = &local_148;
  local_148 = sentinel.second.m_next;
  local_150 = &sentinel;
  pvVar3 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_390,0x8a,1,2,ppCVar4,"sentinel.second.Next()",&local_150,"&sentinel")
  ;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x8b;
  file_13.m_begin = (iterator)&local_3a0;
  msg_13.m_end = (iterator)ppCVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3b0,
             msg_13);
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_011480b0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = "";
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3b8 = "";
  local_148 = sentinel.second.m_prev;
  local_150 = &sentinel;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::pair<COutPoint_const,CCoinsCacheEntry>*,std::pair<COutPoint_const,CCoinsCacheEntry>*>
            (&local_100,&local_3c0,0x8b,1,2,&local_148,"sentinel.second.Prev()",&local_150,
             "&sentinel");
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  CCoinsCacheEntry::~CCoinsCacheEntry(&sentinel.second);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_random_deletion)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Create linked list sentinel->n1->n2->n3->n4->sentinel
    auto n1{nodes.begin()};
    auto n2{std::next(n1)};
    auto n3{std::next(n2)};
    auto n4{std::next(n3)};

    // Delete n2
    // sentinel->n1->n3->n4->sentinel
    nodes.erase(n2);
    // Check that n1 now points to n3, and n3 still points to n4
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n1->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1->second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n3->second.Next(), &(*n4));
    BOOST_CHECK_EQUAL(n3->second.Prev(), &(*n1));

    // Delete n1
    // sentinel->n3->n4->sentinel
    nodes.erase(n1);
    // Check that sentinel now points to n3, and n3 still points to n4
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.Next(), &(*n4));
    BOOST_CHECK_EQUAL(n3->second.Prev(), &sentinel);

    // Delete n4
    // sentinel->n3->sentinel
    nodes.erase(n4);
    // Check that sentinel still points to n3, and n3 points to sentinel
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &(*n3));

    // Delete n3
    // sentinel->sentinel
    nodes.erase(n3);
    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);
}